

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng_ext.c
# Opt level: O3

light_pcapng_t * light_pcapng_open_read(char *file_path,light_boolean read_all_interfaces)

{
  undefined4 uVar1;
  uint16_t uVar2;
  light_pcapng_t *plVar3;
  light_pcapng pcapng;
  light_pcapng_file_info *info;
  light_option p_Var4;
  char *pcVar5;
  uint32_t *puVar6;
  ulong uVar7;
  light_pcapng iter;
  _light_section_header *section_header;
  uint32_t type;
  int local_40;
  undefined4 uStack_3c;
  light_boolean local_38;
  int local_34;
  
  if (file_path == (char *)0x0) {
    light_pcapng_open_read_cold_1();
    plVar3 = (light_pcapng_t *)0x0;
  }
  else {
    plVar3 = (light_pcapng_t *)calloc(1,0x20);
    pcapng = light_read_from_path(file_path);
    plVar3->pcapng = pcapng;
    plVar3->pcapng_iter = pcapng;
    local_34 = -0x21524111;
    if (pcapng != (light_pcapng)0x0) {
      info = (light_pcapng_file_info *)0x0;
      light_get_block_info(pcapng,LIGHT_INFO_TYPE,&local_34,(size_t *)0x0);
      if (local_34 == 0xa0d0d0a) {
        local_38 = read_all_interfaces;
        info = (light_pcapng_file_info *)calloc(1,400);
        pcVar5 = (char *)0x0;
        light_get_block_info(pcapng,LIGHT_INFO_BODY,&local_40,(size_t *)0x0);
        uVar1 = *(undefined4 *)(CONCAT44(uStack_3c,local_40) + 4);
        info->major_version = (short)uVar1;
        info->minor_version = (short)((uint)uVar1 >> 0x10);
        p_Var4 = light_get_option(pcapng,2);
        if (p_Var4 == (light_option)0x0) {
          uVar7 = 0;
        }
        else {
          uVar2 = light_get_option_length(p_Var4);
          uVar7 = (ulong)uVar2;
          pcVar5 = (char *)calloc(uVar7 + 1,1);
          puVar6 = light_get_option_data(p_Var4);
          memcpy(pcVar5,puVar6,uVar7);
          pcVar5[uVar7] = '\0';
        }
        info->hardware_desc_size = uVar7;
        info->hardware_desc = pcVar5;
        p_Var4 = light_get_option(pcapng,3);
        if (p_Var4 == (light_option)0x0) {
          uVar7 = 0;
          pcVar5 = (char *)0x0;
        }
        else {
          uVar2 = light_get_option_length(p_Var4);
          uVar7 = (ulong)uVar2;
          pcVar5 = (char *)calloc(uVar7 + 1,1);
          puVar6 = light_get_option_data(p_Var4);
          memcpy(pcVar5,puVar6,uVar7);
          pcVar5[uVar7] = '\0';
        }
        info->os_desc_size = uVar7;
        info->os_desc = pcVar5;
        p_Var4 = light_get_option(pcapng,4);
        if (p_Var4 == (light_option)0x0) {
          uVar7 = 0;
          pcVar5 = (char *)0x0;
        }
        else {
          uVar2 = light_get_option_length(p_Var4);
          uVar7 = (ulong)uVar2;
          pcVar5 = (char *)calloc(uVar7 + 1,1);
          puVar6 = light_get_option_data(p_Var4);
          memcpy(pcVar5,puVar6,uVar7);
          pcVar5[uVar7] = '\0';
        }
        info->user_app_desc_size = uVar7;
        info->user_app_desc = pcVar5;
        p_Var4 = light_get_option(pcapng,1);
        if (p_Var4 == (light_option)0x0) {
          uVar7 = 0;
          pcVar5 = (char *)0x0;
        }
        else {
          uVar2 = light_get_option_length(p_Var4);
          uVar7 = (ulong)uVar2;
          pcVar5 = (char *)calloc(uVar7 + 1,1);
          puVar6 = light_get_option_data(p_Var4);
          memcpy(pcVar5,puVar6,uVar7);
          pcVar5[uVar7] = '\0';
        }
        info->file_comment_size = uVar7;
        info->file_comment = pcVar5;
        read_all_interfaces = local_38;
      }
      plVar3->file_info = info;
      if (read_all_interfaces != LIGHT_FALSE && pcapng != (light_pcapng)0x0) {
        do {
          local_40 = -0x21524111;
          light_get_block_info(pcapng,LIGHT_INFO_TYPE,&local_40,(size_t *)0x0);
          if (local_40 == 1) {
            __append_interface_block_to_file_info(pcapng,info);
          }
          pcapng = light_next_block(pcapng);
        } while (pcapng != (light_pcapng)0x0);
      }
    }
  }
  return plVar3;
}

Assistant:

light_pcapng_t *light_pcapng_open_read(const char* file_path, light_boolean read_all_interfaces)
{
	DCHECK_NULLP(file_path, return NULL);

	light_pcapng_t *pcapng = calloc(1, sizeof(struct _light_pcapng_t));
	pcapng->pcapng = light_read_from_path(file_path);
	pcapng->pcapng_iter = pcapng->pcapng;
	pcapng->file_info = __create_file_info(pcapng->pcapng);
	pcapng->file = NULL;

	if (read_all_interfaces)
	{
		light_pcapng iter = pcapng->pcapng;
		while (iter != NULL)
		{
			uint32_t type = LIGHT_UNKNOWN_DATA_BLOCK;
			light_get_block_info(iter, LIGHT_INFO_TYPE, &type, NULL);
			if (type == LIGHT_INTERFACE_BLOCK)
				__append_interface_block_to_file_info(iter, pcapng->file_info);
			iter = light_next_block(iter);
		}

	}

	return pcapng;
}